

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  GLFWwindow *handle;
  char *pcVar5;
  uint *__s1;
  ulong uVar6;
  char *args [3];
  char *local_48;
  char *local_40;
  undefined8 local_38;
  
  if (argc < 2) {
    fprintf(_stdout,"%s\n","parent");
    fflush(_stdout);
    local_48 = *argv;
    local_40 = "-child";
    local_38 = 0;
    iVar4 = execute(&local_48);
  }
  else {
    uVar6 = 1;
    do {
      __s1 = (uint *)argv[uVar6];
      iVar4 = strcmp((char *)__s1,"-child");
      if (iVar4 != 0) {
        main_cold_1();
        if ((*(long *)(__s1 + 10) == 0) ||
           ((*__s1 != 0 && (*(int *)(*(long *)(__s1 + 10) + 0x200) != 0)))) {
          uVar6 = (ulong)__s1[1];
          if (__s1[1] - 0x36001 < 3) {
            uVar1 = *__s1;
            uVar6 = (ulong)uVar1;
            if (uVar1 != 0) {
              if (uVar1 == 0x30001) {
                uVar1 = __s1[2];
                if (((((int)uVar1 < 1) || (uVar2 = __s1[3], (int)uVar2 < 0)) ||
                    (uVar1 == 1 && 5 < (int)uVar2)) ||
                   ((uVar1 == 2 && 1 < (int)uVar2 || (3 < (int)uVar2 && uVar1 == 3)))) {
                  uVar2 = __s1[3];
                  pcVar5 = "Invalid OpenGL version %i.%i";
LAB_00107e72:
                  _glfwInputError(0x10004,pcVar5,(ulong)uVar1,(ulong)uVar2);
                  return 0;
                }
                uVar3 = __s1[7];
                if (uVar3 - 0x32001 < 2) {
                  if ((2 < (int)uVar1) && (uVar1 != 3 || 1 < (int)uVar2)) goto LAB_00107ec4;
                  pcVar5 = "Context profiles are only defined for OpenGL version 3.2 and above";
                }
                else {
                  if (uVar3 != 0) {
                    pcVar5 = "Invalid OpenGL profile 0x%08X";
                    uVar6 = (ulong)uVar3;
                    goto LAB_00107e1b;
                  }
LAB_00107ec4:
                  if ((2 < (int)uVar1) || (__s1[4] == 0)) goto LAB_00107ee2;
                  pcVar5 = "Forward-compatibility is only defined for OpenGL version 3.0 and above";
                }
                iVar4 = 0x10004;
                goto LAB_00107e04;
              }
              if (uVar1 != 0x30002) {
                pcVar5 = "Invalid client API 0x%08X";
                goto LAB_00107e1b;
              }
              uVar1 = __s1[2];
              if (((((int)uVar1 < 1) || (uVar2 = __s1[3], (int)uVar2 < 0)) ||
                  (uVar1 == 1 && 1 < (int)uVar2)) || (uVar2 != 0 && uVar1 == 2)) {
                uVar2 = __s1[3];
                pcVar5 = "Invalid OpenGL ES version %i.%i";
                goto LAB_00107e72;
              }
            }
LAB_00107ee2:
            uVar1 = __s1[8];
            uVar6 = (ulong)uVar1;
            if ((uVar1 - 0x31001 < 2) || (uVar1 == 0)) {
              uVar1 = __s1[9];
              uVar6 = (ulong)uVar1;
              if (uVar1 - 0x35001 < 2) {
                return 1;
              }
              if (uVar1 == 0) {
                return 1;
              }
              pcVar5 = "Invalid context release behavior 0x%08X";
            }
            else {
              pcVar5 = "Invalid context robustness mode 0x%08X";
            }
          }
          else {
            pcVar5 = "Invalid context creation API 0x%08X";
          }
LAB_00107e1b:
          _glfwInputError(0x10003,pcVar5,uVar6);
        }
        else {
          iVar4 = 0x1000a;
          pcVar5 = (char *)0x0;
LAB_00107e04:
          _glfwInputError(iVar4,pcVar5);
        }
        return 0;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)argc != uVar6);
    iVar4 = 0;
    fprintf(_stdout,"%s\n","child");
    fflush(_stdout);
    glfwInit();
    glfwWindowHint(0x20004,0);
    handle = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle == (GLFWwindow *)0x0) {
      iVar4 = 0x7d;
    }
    else {
      glfwMakeContextCurrent(handle);
      glFlush();
      glfwDestroyWindow(handle);
      glfwTerminate();
    }
  }
  return iVar4;
}

Assistant:

int
main(int argc, char **argv)
{
    GLboolean child = GL_FALSE;
    int i;

    for (i = 1; i < argc; ++i) {
        const char *arg = argv[i];
        if (strcmp(arg, "-child") == 0) {
            child = GL_TRUE;
        } else {
            fprintf(stderr, "error: unknown arg %s\n", arg);
            exit(1);
        }
    }

    fprintf(stdout, "%s\n", child ? "child" : "parent");
    fflush(stdout);

    if (child) {
        GLFWwindow* window = NULL;

        glfwInit();

        glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

        window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
        if (!window) {
             return EXIT_SKIP;
        }

        glfwMakeContextCurrent(window);

        glFlush();

        glfwDestroyWindow(window);
        glfwTerminate();

        return 0;
    } else {
        const char *args[3];

        args[0] = argv[0];
        args[1] = "-child";
        args[2] = NULL;
        return execute((char * const *)args);
    }
}